

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

DefaultSkewItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultSkewItemSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::ClockingDirectionSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,ClockingDirectionSyntax *args_2,Token *args_3)

{
  Info *pIVar1;
  size_t sVar2;
  pointer ppAVar3;
  Info *pIVar4;
  SyntaxNode *pSVar5;
  undefined4 uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  DefaultSkewItemSyntax *pDVar15;
  long lVar16;
  
  pDVar15 = (DefaultSkewItemSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DefaultSkewItemSyntax *)this->endPtr < pDVar15 + 1) {
    pDVar15 = (DefaultSkewItemSyntax *)allocateSlow(this,0x78,8);
  }
  else {
    this->head->current = (byte *)(pDVar15 + 1);
  }
  TVar7 = args_1->kind;
  uVar8 = args_1->field_0x2;
  NVar9.raw = (args_1->numFlags).raw;
  uVar10 = args_1->rawLen;
  pIVar1 = args_1->info;
  TVar11 = args_3->kind;
  uVar12 = args_3->field_0x2;
  NVar13.raw = (args_3->numFlags).raw;
  uVar14 = args_3->rawLen;
  pIVar4 = args_3->info;
  (pDVar15->super_MemberSyntax).super_SyntaxNode.kind = DefaultSkewItem;
  (pDVar15->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pDVar15->super_MemberSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  uVar6 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar5 = (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pDVar15->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)
   &(pDVar15->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar6
  ;
  (pDVar15->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar5;
  (pDVar15->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (pDVar15->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005c8270;
  (pDVar15->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_SyntaxListBase).childCount;
  sVar2 = (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (pDVar15->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)._M_ptr;
  (pDVar15->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pDVar15->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005c8770;
  (pDVar15->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)pDVar15;
  sVar2 = (pDVar15->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar2 != 0) {
    ppAVar3 = (pDVar15->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar16 = 0;
    do {
      *(DefaultSkewItemSyntax **)(*(long *)((long)ppAVar3 + lVar16) + 8) = pDVar15;
      lVar16 = lVar16 + 8;
    } while (sVar2 << 3 != lVar16);
  }
  (pDVar15->keyword).kind = TVar7;
  (pDVar15->keyword).field_0x2 = uVar8;
  (pDVar15->keyword).numFlags = (NumericTokenFlags)NVar9.raw;
  (pDVar15->keyword).rawLen = uVar10;
  (pDVar15->keyword).info = pIVar1;
  (pDVar15->direction).ptr = args_2;
  (pDVar15->semi).kind = TVar11;
  (pDVar15->semi).field_0x2 = uVar12;
  (pDVar15->semi).numFlags = (NumericTokenFlags)NVar13.raw;
  (pDVar15->semi).rawLen = uVar14;
  (pDVar15->semi).info = pIVar4;
  (args_2->super_SyntaxNode).parent = (SyntaxNode *)pDVar15;
  return pDVar15;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }